

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HModel.cpp
# Opt level: O1

bool __thiscall HModel::OKtoSolve(HModel *this,int level,int phase)

{
  bool bVar1;
  undefined4 in_EAX;
  int iVar2;
  char *__s;
  ulong uVar3;
  bool bVar4;
  undefined1 auVar5 [16];
  
  auVar5._0_4_ = -(uint)(this->mlFg_haveBasis == 0);
  auVar5._4_4_ = -(uint)(this->mlFg_haveMatrixColWise == 0);
  auVar5._8_4_ = -(uint)(this->mlFg_haveMatrixRowWise == 0);
  auVar5._12_4_ = -(uint)(this->mlFg_haveFactorArrays == 0);
  iVar2 = movmskps(in_EAX,auVar5);
  bVar4 = false;
  if ((iVar2 == 0) && (bVar4 = false, this->mlFg_haveEdWt != 0)) {
    bVar4 = this->mlFg_haveInvert != 0;
  }
  if (bVar4 == false) {
    if (this->mlFg_haveBasis == 0) {
      printf("Not OK to solve since mlFg_haveBasis = %d\n",0);
    }
    if (this->mlFg_haveMatrixColWise == 0) {
      printf("Not OK to solve since mlFg_haveMatrixColWise = %d\n",0);
    }
    if (this->mlFg_haveMatrixRowWise == 0) {
      printf("Not OK to solve since mlFg_haveMatrixRowWise  = %d\n",0);
    }
    if (this->mlFg_haveFactorArrays == 0) {
      printf("Not OK to solve since mlFg_haveFactorArrays = %d\n",0);
    }
    if (this->mlFg_haveEdWt == 0) {
      printf("Not OK to solve since mlFg_haveEdWt = %d\n",0);
    }
    if (this->mlFg_haveInvert == 0) {
      printf("Not OK to solve since mlFg_haveInvert = %d\n",0);
    }
    std::ostream::flush();
  }
  if (level < 1) {
    return bVar4;
  }
  bVar4 = nonbasicFlagBasicIndex_OK(this,this->numCol,this->numRow);
  if (bVar4) {
    bVar4 = workArrays_OK(this,phase);
    if (bVar4) {
      bVar1 = 0 < this->numTot;
      if (0 < this->numTot) {
        uVar3 = 0;
        do {
          if (((this->nonbasicFlag).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start[uVar3] != 0) &&
             (bVar4 = oneNonbasicMoveVsWorkArrays_OK(this,(int)uVar3), !bVar4)) {
            printf("Error in nonbasicMoveVsWorkArrays for variable %d\n",uVar3 & 0xffffffff);
            std::ostream::flush();
            break;
          }
          uVar3 = uVar3 + 1;
          bVar1 = (long)uVar3 < (long)this->numTot;
        } while ((long)uVar3 < (long)this->numTot);
      }
      if (bVar1) {
        return false;
      }
      if (level == 1) {
        return bVar4;
      }
      printf("OKtoSolve(%1d) not implemented\n",level);
      goto LAB_0012afd9;
    }
    __s = "Error in workArrays";
  }
  else {
    __s = "Error in nonbasicFlag and basicIndex";
  }
  puts(__s);
  bVar4 = false;
LAB_0012afd9:
  std::ostream::flush();
  return bVar4;
}

Assistant:

bool HModel::OKtoSolve(int level, int phase) {
  //  printf("Called OKtoSolve(%1d, %1d)\n", level, phase);
  bool ok;
  // Level 0: Minimal check - just look at flags. This means we trust them!
  ok = mlFg_haveBasis
    && mlFg_haveMatrixColWise
    && mlFg_haveMatrixRowWise 
    && mlFg_haveFactorArrays
    && mlFg_haveEdWt
    && mlFg_haveInvert
    ;
  if (!ok) {
    if (!mlFg_haveBasis) printf("Not OK to solve since mlFg_haveBasis = %d\n", mlFg_haveBasis);
    if (!mlFg_haveMatrixColWise) printf("Not OK to solve since mlFg_haveMatrixColWise = %d\n", mlFg_haveMatrixColWise);
    if (!mlFg_haveMatrixRowWise) printf("Not OK to solve since mlFg_haveMatrixRowWise  = %d\n", mlFg_haveMatrixRowWise);
    if (!mlFg_haveFactorArrays) printf("Not OK to solve since mlFg_haveFactorArrays = %d\n", mlFg_haveFactorArrays);
    if (!mlFg_haveEdWt) printf("Not OK to solve since mlFg_haveEdWt = %d\n", mlFg_haveEdWt);
    if (!mlFg_haveInvert) printf("Not OK to solve since mlFg_haveInvert = %d\n", mlFg_haveInvert);
    cout << flush;
  }
#ifdef JAJH_dev
  assert(ok);
#endif
  if (level <= 0) return ok;
  // Level 1: Basis and data check
  ok = nonbasicFlagBasicIndex_OK(numCol, numRow);
  if (!ok) {
    printf("Error in nonbasicFlag and basicIndex\n");cout << flush;
#ifdef JAJH_dev
    assert(ok);
#endif
    return ok;
  }
  ok = workArrays_OK(phase);
  if (!ok) {
    printf("Error in workArrays\n");cout << flush;
#ifdef JAJH_dev
    assert(ok);
#endif
    return ok;
  }
  for (int var = 0; var < numTot; ++var) {
    if (nonbasicFlag[var]) {
      //Nonbasic variable
      ok = oneNonbasicMoveVsWorkArrays_OK(var);
      if (!ok) {
	printf("Error in nonbasicMoveVsWorkArrays for variable %d\n", var);cout << flush;
#ifdef JAJH_dev
	assert(ok);
#endif
	return ok;
      }
    } 
  }
  if (level <= 1) return ok;
  printf("OKtoSolve(%1d) not implemented\n", level);cout << flush;
  return ok;
}